

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void charactersTokenizer(void *ctx,xmlChar *ch,int len)

{
  long lVar1;
  xmlTokenizerConfig *config;
  xmlParserCtxtPtr ctxt;
  int len_local;
  xmlChar *ch_local;
  void *ctx_local;
  
  lVar1 = *(long *)((long)ctx + 0x1a8);
  if (*(int *)(lVar1 + 4) == 0) {
    fprintf((FILE *)SAXdebug,"Character\n");
    *(undefined4 *)(lVar1 + 4) = 1;
  }
  fwrite(ch,1,(long)len,(FILE *)SAXdebug);
  return;
}

Assistant:

static void
charactersTokenizer(void *ctx, const xmlChar *ch, int len) {
    xmlParserCtxtPtr ctxt = ctx;
    xmlTokenizerConfig *config = ctxt->_private;

    if (!config->inCharacters) {
        fprintf(SAXdebug, "Character\n");
        config->inCharacters = 1;
    }

    fwrite(ch, 1, len, SAXdebug);
}